

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall gss::innards::Proof::create_forbidden_assignment_constraint(Proof *this,int p,int t)

{
  pointer pIVar1;
  pair<int,_int> *__args;
  mapped_type *pmVar2;
  ostream *poVar3;
  map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
  *in_RDI;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__args_1;
  pair<int,_int> local_30;
  pair<int,_int> in_stack_ffffffffffffffd8;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffe0;
  int local_10;
  int local_c [3];
  
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x181020);
  std::operator<<((ostream *)&pIVar1->field_0x50,"* forbidden assignment\n");
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x181041);
  __args = (pair<int,_int> *)std::operator<<((ostream *)&pIVar1->field_0x50,"1 ~x");
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x181067);
  __args_1 = &pIVar1->variable_mappings;
  std::pair<int,_int>::pair<int_&,_int_&,_true>
            ((pair<int,_int> *)&stack0xffffffffffffffd8,local_c,&local_10);
  std::pair<long,_long>::pair<int,_int,_true>
            ((pair<long,_long> *)&stack0xffffffffffffffe0,(pair<int,_int> *)&stack0xffffffffffffffd8
            );
  pmVar2 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_ffffffffffffffe0,(key_type *)in_stack_ffffffffffffffd8);
  poVar3 = std::operator<<((ostream *)__args,(string *)pmVar2);
  std::operator<<(poVar3," >= 1 ;\n");
  pIVar1 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x1810ca);
  pIVar1->nb_constraints = pIVar1->nb_constraints + 1;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x1810e6);
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_30,local_c,&local_10);
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x18110f);
  std::
  map<std::pair<long,long>,long,std::less<std::pair<long,long>>,std::allocator<std::pair<std::pair<long,long>const,long>>>
  ::emplace<std::pair<int,int>,long&>(in_RDI,__args,(long *)__args_1);
  return;
}

Assistant:

auto Proof::create_forbidden_assignment_constraint(int p, int t) -> void
{
    _imp->model_stream << "* forbidden assignment\n";
    _imp->model_stream << "1 ~x" << _imp->variable_mappings[pair{p, t}] << " >= 1 ;\n";
    ++_imp->nb_constraints;
    _imp->eliminations.emplace(pair{p, t}, _imp->nb_constraints);
}